

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  undefined2 uVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  sbyte sVar4;
  uchar uVar5;
  unsigned_short grey;
  int iVar6;
  size_t sVar7;
  uchar uVar8;
  undefined8 extraout_RAX;
  uchar uVar12;
  size_t sVar10;
  LodePNGColorMode *pLVar11;
  unsigned_short *a_00;
  byte bVar13;
  uint bits;
  uint uVar14;
  uchar uVar15;
  undefined8 extraout_RDX;
  ulong uVar16;
  long lVar17;
  unsigned_short *r_00;
  ulong uVar18;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_d8;
  unsigned_short local_d6;
  unsigned_short local_d4;
  unsigned_short local_d2;
  ulong local_d0;
  uchar *local_c8;
  LodePNGColorMode *local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  int local_38;
  uchar uVar9;
  
  iVar6 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar6 != 0) {
    sVar7 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar7 == 0) {
      return 0;
    }
    sVar10 = 0;
    do {
      out[sVar10] = in[sVar10];
      sVar10 = sVar10 + 1;
    } while (sVar7 != sVar10);
    return 0;
  }
  local_d0 = (ulong)(h * w);
  local_c8 = out;
  local_c0 = mode_out;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar18 = mode_out->palettesize;
    uVar16 = 1L << ((ulong)(byte)mode_out->bitdepth & 0x3f);
    pLVar11 = mode_out;
    if (uVar18 == 0) {
      uVar18 = mode_in->palettesize;
      pLVar11 = mode_in;
    }
    puVar2 = pLVar11->palette;
    if (uVar18 < uVar16) {
      uVar16 = uVar18;
    }
    local_78 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    local_b8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    local_38 = -1;
    if (uVar18 != 0) {
      uVar18 = 0;
      do {
        color_tree_add((ColorTree *)local_b8,puVar2[uVar18 * 4],puVar2[uVar18 * 4 + 1],
                       puVar2[uVar18 * 4 + 2],puVar2[uVar18 * 4 + 3],(uint)uVar18);
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
  }
  pLVar11 = local_c0;
  puVar2 = local_c8;
  if (local_c0->bitdepth == 0x10 && mode_in->bitdepth == 0x10) {
    if (local_d0 != 0) {
      lVar17 = 0;
      sVar7 = 0;
      do {
        local_d2 = 0;
        local_d4 = 0;
        local_d6 = 0;
        local_d8 = 0;
        getPixelColorRGBA16(&local_d2,&local_d4,&local_d6,&local_d8,in,sVar7,mode_in);
        uVar5 = (uchar)local_d2;
        uVar8 = (uchar)(local_d2 >> 8);
        uVar12 = (uchar)(local_d8 >> 8);
        uVar15 = (uchar)(local_d4 >> 8);
        uVar9 = (uchar)(local_d6 >> 8);
        switch(local_c0->colortype) {
        case LCT_GREY:
          uVar1 = swap_bytes(local_d2);
          *(undefined2 *)(local_c8 + sVar7 * 2) = uVar1;
          break;
        case LCT_RGB:
          local_c8[lVar17] = uVar8;
          local_c8[lVar17 + 1] = uVar5;
          local_c8[lVar17 + 2] = uVar15;
          local_c8[lVar17 + 3] = (uchar)local_d4;
          local_c8[lVar17 + 4] = uVar9;
          local_c8[lVar17 + 5] = (uchar)local_d6;
          break;
        case LCT_GREY_ALPHA:
          local_c8[sVar7 * 4] = uVar8;
          local_c8[sVar7 * 4 + 1] = uVar5;
          local_c8[sVar7 * 4 + 2] = uVar12;
          local_c8[sVar7 * 4 + 3] = (uchar)local_d8;
          break;
        case LCT_RGBA:
          local_c8[sVar7 * 8] = uVar8;
          local_c8[sVar7 * 8 + 1] = uVar5;
          local_c8[sVar7 * 8 + 2] = uVar15;
          local_c8[sVar7 * 8 + 3] = (uchar)local_d4;
          local_c8[sVar7 * 8 + 4] = uVar9;
          local_c8[sVar7 * 8 + 5] = (uchar)local_d6;
          local_c8[sVar7 * 8 + 6] = uVar12;
          local_c8[sVar7 * 8 + 7] = (uchar)local_d8;
        }
        sVar7 = sVar7 + 1;
        lVar17 = lVar17 + 6;
      } while (local_d0 != sVar7);
    }
    goto LAB_0034eea4;
  }
  if (local_c0->bitdepth == 8) {
    if (local_c0->colortype == LCT_RGB) {
      uVar14 = 0;
    }
    else {
      if (local_c0->colortype != LCT_RGBA) goto LAB_0034ecdb;
      uVar14 = 1;
    }
    getPixelColorsRGBA8(local_c8,local_d0,uVar14,in,mode_in);
  }
  else {
LAB_0034ecdb:
    local_d2 = local_d2 & 0xff00;
    local_d4 = local_d4 & 0xff00;
    local_d6 = local_d6 & 0xff00;
    local_d8 = local_d8 & 0xff00;
    if (local_d0 != 0) {
      lVar17 = 0;
      sVar7 = 0;
      do {
        r_00 = &local_d2;
        a_00 = &local_d8;
        getPixelColorRGBA8((uchar *)r_00,(uchar *)&local_d4,(uchar *)&local_d6,(uchar *)a_00,in,
                           sVar7,mode_in);
        if (pLVar11->colortype < 7) {
          uVar18 = CONCAT71((int7)((ulong)extraout_RAX >> 8),(byte)local_d2);
          switch(pLVar11->colortype) {
          case LCT_GREY:
            bits = pLVar11->bitdepth;
            if (bits == 0x10) {
              puVar2[sVar7 * 2 + 1] = (byte)local_d2;
              puVar2[sVar7 * 2] = (byte)local_d2;
            }
            else {
              if (bits != 8) {
                bVar13 = (byte)bits;
                sVar4 = (bVar13 < 0x21) * (' ' - bVar13);
                uVar14 = ((uint)((byte)local_d2 >> ((byte)(8 - bVar13) & 0x1f)) << sVar4) >> sVar4;
                goto LAB_0034ee53;
              }
LAB_0034edaa:
              puVar2[sVar7] = (uchar)uVar18;
            }
            break;
          case LCT_RGB:
            if (pLVar11->bitdepth == 8) {
              puVar2[lVar17] = (byte)local_d2;
              puVar2[lVar17 + 1] = (uchar)local_d4;
              puVar2[lVar17 + 2] = (uchar)local_d6;
            }
            else {
              puVar2[lVar17 * 2 + 1] = (byte)local_d2;
              puVar2[lVar17 * 2] = (byte)local_d2;
              puVar2[lVar17 * 2 + 3] = (uchar)local_d4;
              puVar2[lVar17 * 2 + 2] = (uchar)local_d4;
              puVar2[lVar17 * 2 + 5] = (uchar)local_d6;
              puVar2[lVar17 * 2 + 4] = (uchar)local_d6;
            }
            break;
          case LCT_PALETTE:
            uVar14 = color_tree_get((ColorTree *)local_b8,(byte)local_d2,(uchar)local_d4,
                                    (uchar)local_d6,(uchar)local_d8);
            uVar18 = (ulong)uVar14;
            if ((int)uVar14 < 0) {
              return 0x52;
            }
            bits = pLVar11->bitdepth;
            if (bits == 8) goto LAB_0034edaa;
LAB_0034ee53:
            addColorBits(puVar2,sVar7,bits,uVar14);
            break;
          case LCT_GREY_ALPHA:
            if (pLVar11->bitdepth == 0x10) {
              puVar2[sVar7 * 4 + 1] = (byte)local_d2;
              puVar2[sVar7 * 4] = (byte)local_d2;
              puVar2[sVar7 * 4 + 3] = (uchar)local_d8;
              puVar2[sVar7 * 4 + 2] = (uchar)local_d8;
            }
            else if (pLVar11->bitdepth == 8) {
              puVar2[sVar7 * 2] = (byte)local_d2;
              puVar2[sVar7 * 2 + 1] = (uchar)local_d8;
            }
            break;
          case LCT_RGBA:
            if (pLVar11->bitdepth == 8) {
              puVar2[sVar7 * 4] = (byte)local_d2;
              puVar2[sVar7 * 4 + 1] = (uchar)local_d4;
              puVar2[sVar7 * 4 + 2] = (uchar)local_d6;
              puVar2[sVar7 * 4 + 3] = (uchar)local_d8;
            }
            else {
              auVar3 = vpinsrb_avx(ZEXT416((uint)uVar18),
                                   (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),(uchar)local_d4),1
                                  );
              auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)a_00 >> 8),(uchar)local_d6),2)
              ;
              auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)r_00 >> 8),(uchar)local_d8),3)
              ;
              auVar3 = vpunpcklbw_avx(auVar3,auVar3);
              *(long *)(puVar2 + sVar7 * 8) = auVar3._0_8_;
            }
          }
        }
        sVar7 = sVar7 + 1;
        lVar17 = lVar17 + 3;
      } while (local_d0 != sVar7);
    }
  }
LAB_0034eea4:
  if (local_c0->colortype == LCT_PALETTE) {
    color_tree_cleanup((ColorTree *)local_b8);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}